

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

bool __thiscall ON_SimpleArray<int>::Permute(ON_SimpleArray<int> *this,int *index)

{
  bool bVar1;
  void *__dest;
  long lVar2;
  
  if (this->m_a != (int *)0x0) {
    if (index == (int *)0x0 || (long)this->m_count < 1) {
      bVar1 = false;
    }
    else {
      __dest = onmalloc((long)this->m_count << 2);
      memcpy(__dest,this->m_a,(long)this->m_count << 2);
      if (0 < this->m_count) {
        lVar2 = 0;
        do {
          this->m_a[lVar2] = *(int *)((long)__dest + (long)index[lVar2] * 4);
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->m_count);
      }
      onfree(__dest);
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::Permute( const int* index )
{
  bool rc = false;
  if ( m_a && m_count > 0 && index ) {
    int i;
    T* buffer = (T*)onmalloc(m_count*sizeof(buffer[0]));
    memcpy( (void*)(buffer), (void*)(m_a), m_count*sizeof(T) );
    for (i = 0; i < m_count; i++ )
      memcpy( (void*)(m_a+i), (void*)(buffer+index[i]), sizeof(T) ); // must use memcopy and not operator=
    onfree(buffer);
    rc = true;
  }
  return rc;
}